

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-cave.c
# Opt level: O0

void do_cmd_go_up(command *cmd)

{
  short sVar1;
  wchar_t feat_00;
  loc_conflict grid;
  loc_conflict grid_00;
  loc_conflict grid_01;
  loc_conflict grid_02;
  loc_conflict grid_03;
  level_conflict *plVar2;
  _Bool _Var3;
  wchar_t place;
  int iVar4;
  wchar_t wVar5;
  feature *pfVar6;
  char *direction;
  level_conflict *plVar7;
  level *up;
  level *lev;
  wchar_t new_place;
  wchar_t feat;
  command *cmd_local;
  
  grid.x = (player->grid).x;
  grid.y = (player->grid).y;
  pfVar6 = square_feat((chunk *)cave,grid);
  feat_00 = pfVar6->fidx;
  grid_00.x = (player->grid).x;
  grid_00.y = (player->grid).y;
  _Var3 = square_isstairs((chunk *)cave,grid_00);
  if ((_Var3) ||
     (grid_01.x = (player->grid).x, grid_01.y = (player->grid).y,
     _Var3 = square_ispath((chunk *)cave,grid_01), _Var3)) {
    grid_02.x = (player->grid).x;
    grid_02.y = (player->grid).y;
    _Var3 = square_isdownstairs((chunk *)cave,grid_02);
    if (_Var3) {
      grid_03.x = (player->grid).x;
      grid_03.y = (player->grid).y;
      _Var3 = square_ispath((chunk *)cave,grid_03);
      if (_Var3) {
        msg("This is a path to greater danger.");
      }
      else {
        msg("This staircase leads down.");
      }
    }
    else if ((player->themed_level == '\0') ||
            (_Var3 = get_check("This level will never appear again.  Really leave?"), _Var3)) {
      sVar1 = player->place;
      direction = path_direction(feat_00);
      place = player_get_next_place((int)sVar1,direction,L'\x01');
      player->upkeep->energy_use = (uint)z_info->move_energy;
      if (feat_00 == FEAT_LESS) {
        iVar4 = strcmp(world->name,"Hybrid Dungeon");
        if ((iVar4 == 0) && (player->depth != 1)) {
          plVar2 = world->levels;
          sVar1 = player->place;
          if (plVar2[sVar1].up == (char *)0x0) {
            msg("Nothing happens!");
            return;
          }
          plVar7 = level_by_name(world,plVar2[sVar1].up);
          if (plVar2[sVar1].locality != plVar7->locality) {
            msgt(0x4e,"You trigger a magic portal.");
            player_change_place(player,place);
            return;
          }
        }
        msgt(0x4e,"You enter a maze of up staircases.");
      }
      else {
        msgt(0x4e,"You enter a winding path to less danger.");
      }
      wVar5 = return_path(feat_00);
      player->upkeep->create_stair = wVar5;
      if ((((feat_00 == FEAT_LESS_NORTH) || (feat_00 == FEAT_MORE_NORTH)) ||
          (feat_00 == FEAT_LESS_SOUTH)) || (feat_00 == FEAT_MORE_SOUTH)) {
        player->upkeep->path_coord = (player->grid).x;
      }
      else if (((feat_00 == FEAT_LESS_EAST) || (feat_00 == FEAT_MORE_EAST)) ||
              ((feat_00 == FEAT_LESS_WEST || (feat_00 == FEAT_MORE_WEST)))) {
        player->upkeep->path_coord = (player->grid).y;
      }
      player_change_place(player,place);
    }
  }
  else {
    do_cmd_navigate_up(cmd);
  }
  return;
}

Assistant:

void do_cmd_go_up(struct command *cmd)
{
	int feat = square_feat(cave, player->grid)->fidx;
	int new_place;

	/* Verify stairs */
	if (!(square_isstairs(cave, player->grid) ||
		  square_ispath(cave, player->grid))) {
		do_cmd_navigate_up(cmd);
		return;
	} else if (square_isdownstairs(cave, player->grid)) {
		if (square_ispath(cave, player->grid)) {
			msg("This is a path to greater danger.");
			return;
		} else {
			msg("This staircase leads down.");
			return;
		}
	}

	/* Make certain the player really wants to leave a themed level. -LM- */
	if (player->themed_level) {
		if (!get_check("This level will never appear again.  Really leave?")) {
			return;
		}
	}

	/* Force descend */
	//if (OPT(player, birth_force_descend)) {
	//	msg("Nothing happens!");
	//	return;
	//}

	new_place = player_get_next_place(player->place, path_direction(feat), 1);

	/* Take a turn */
	player->upkeep->energy_use = z_info->move_energy;

	/* Success */
	if (feat == FEAT_LESS) {
		/* Magical portal for dungeon-only games */
		if (streq(world->name, "Hybrid Dungeon") && (player->depth != 1)) {
			struct level *lev = &world->levels[player->place];
			if (lev->up) {
				struct level *up = level_by_name(world, lev->up);
				if (lev->locality != up->locality) {
					/* Portal */
					msgt(MSG_STAIRS_UP, "You trigger a magic portal.");

					/* Change level */
					player_change_place(player, new_place);
					return;
				}
			} else {
				msg("Nothing happens!");
				return;
			}
		}
		msgt(MSG_STAIRS_UP, "You enter a maze of up staircases.");
	} else {
		msgt(MSG_STAIRS_UP, "You enter a winding path to less danger.");
	}

	/* Create a way back */
	player->upkeep->create_stair = return_path(feat);

	/* Record the non-obvious exit coordinate */
	if ((feat == FEAT_LESS_NORTH) || (feat == FEAT_MORE_NORTH) ||
		(feat == FEAT_LESS_SOUTH) || (feat == FEAT_MORE_SOUTH)) {
		player->upkeep->path_coord = player->grid.x;
	} else if ((feat == FEAT_LESS_EAST) || (feat == FEAT_MORE_EAST) ||
			   (feat == FEAT_LESS_WEST) || (feat == FEAT_MORE_WEST)) {
		player->upkeep->path_coord = player->grid.y;
	}

	/* Change level */
	player_change_place(player, new_place);
}